

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool QFileSystemEngine::rmpath(QFileSystemEntry *entry)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  __off_t extraout_RDX;
  __off_t __length;
  __off_t extraout_RDX_00;
  char *pcVar4;
  long in_FS_OFFSET;
  QMessageLogger local_80;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath((QString *)&local_60,entry);
  QDir::cleanPath((QString *)&local_80,(QString *)&local_60);
  QString::toLocal8Bit((QByteArray *)&local_48,(QString *)&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
    local_80.context.version = 2;
    local_80.context.function._4_4_ = 0;
    local_80.context._4_8_ = 0;
    local_80.context._12_8_ = 0;
    local_80.context.category = "default";
    QMessageLogger::warning(&local_80,"Empty filename passed to function");
LAB_00373e42:
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else {
    bVar1 = qIsFilenameBroken((QByteArray *)&local_48);
    if (bVar1) {
      local_80.context.version = 2;
      local_80.context.function._4_4_ = 0;
      local_80.context._4_8_ = 0;
      local_80.context._12_8_ = 0;
      local_80.context.category = "default";
      QMessageLogger::warning(&local_80,"Broken filename passed to function");
      goto LAB_00373e42;
    }
    pcVar4 = local_48.ptr;
    if (local_48.ptr == (char *)0x0) {
      pcVar4 = &QByteArray::_empty;
    }
    iVar2 = ::rmdir(pcVar4);
    if (iVar2 == 0) {
      pcVar4 = (char *)QByteArray::lastIndexOf((QByteArray *)&local_48,'/',-1);
      __length = extraout_RDX;
      while (bVar1 = true, 0 < (long)pcVar4) {
        QByteArray::truncate((QByteArray *)&local_48,pcVar4,__length);
        pcVar4 = local_48.ptr;
        if (local_48.ptr == (char *)0x0) {
          pcVar4 = &QByteArray::_empty;
        }
        iVar2 = ::rmdir(pcVar4);
        if (iVar2 != 0) break;
        pcVar4 = (char *)QByteArray::lastIndexOf((QByteArray *)&local_48,'/',-1);
        __length = extraout_RDX_00;
      }
      goto LAB_00373d5b;
    }
  }
  bVar1 = false;
LAB_00373d5b:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::rmpath(const QFileSystemEntry &entry)
{
    QByteArray path = QFile::encodeName(QDir::cleanPath(entry.filePath()));
    Q_CHECK_FILE_NAME(path, false);

    if (::rmdir(path.constData()) != 0)
        return false; // Only return false if `entry` couldn't be deleted

    const char sep = QDir::separator().toLatin1();
    qsizetype slash = path.lastIndexOf(sep);
    // `slash > 0` because truncate(0) would make `path` empty
    for (; slash > 0; slash = path.lastIndexOf(sep)) {
        path.truncate(slash);
        if (::rmdir(path.constData()) != 0)
            break;
    }

    return true;
}